

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt8CnfSize(word *t,int nVars)

{
  int iVar1;
  int iVar2;
  ulong uStack_58;
  int nCubes;
  word tc [4];
  word uRes [4];
  int nVars_local;
  word *t_local;
  
  uStack_58 = *t ^ 0xffffffffffffffff;
  tc[0] = t[1] ^ 0xffffffffffffffff;
  tc[1] = t[2] ^ 0xffffffffffffffff;
  tc[2] = t[3] ^ 0xffffffffffffffff;
  iVar1 = Abc_Tt8Isop(t,t,nVars,tc + 3);
  iVar2 = Abc_Tt8Isop(&stack0xffffffffffffffa8,&stack0xffffffffffffffa8,nVars,tc + 3);
  if (iVar2 + iVar1 < 0x101) {
    return iVar2 + iVar1;
  }
  __assert_fail("nCubes <= 256",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                ,0x973,"int Abc_Tt8CnfSize(word *, int)");
}

Assistant:

static inline int Abc_Tt8CnfSize( word t[4], int nVars )
{
    word uRes[4], tc[4] = {~t[0], ~t[1], ~t[2], ~t[3]};
    int nCubes = 0;
    nCubes += Abc_Tt8Isop( t,  t,  nVars, uRes );
    nCubes += Abc_Tt8Isop( tc, tc, nVars, uRes );
    assert( nCubes <= 256 );
    return nCubes;
}